

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall test_block60000_verification::test_method(test_block60000_verification *this)

{
  char *pcVar1;
  ethash_h256_t header_hash;
  undefined8 *puVar2;
  undefined8 uVar3;
  ethash_light_t light;
  long lVar4;
  ethash_return_value_t ret;
  ethash_h256_t seedhash;
  shared_count sStack_f0;
  ethash_return_value_t local_e8;
  ethash_h256_t local_a0;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  undefined **local_40;
  undefined1 local_38;
  undefined8 *local_30;
  char **local_28;
  
  light = ethash_light_new(60000);
  puVar2 = (undefined8 *)(local_e8.result.b + 0x10);
  local_e8.result.b._0_8_ = puVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"5fc898f16035bf5ac9c6d9077ae1e3d5fc1ecc3c9fd5bee8bb00e810fdacbaa0",
             "");
  stringToBlockhash(&local_a0,(string *)&local_e8);
  if ((undefined8 *)local_e8.result.b._0_8_ != puVar2) {
    operator_delete((void *)local_e8.result.b._0_8_);
  }
  if (light == (ethash_light_t)0x0) {
    __assert_fail("light",
                  "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
                  ,0x27e,"void test_block60000_verification::test_method()");
  }
  header_hash.b[8] = local_a0.b[8];
  header_hash.b[9] = local_a0.b[9];
  header_hash.b[10] = local_a0.b[10];
  header_hash.b[0xb] = local_a0.b[0xb];
  header_hash.b[0xc] = local_a0.b[0xc];
  header_hash.b[0xd] = local_a0.b[0xd];
  header_hash.b[0xe] = local_a0.b[0xe];
  header_hash.b[0xf] = local_a0.b[0xf];
  header_hash.b[0] = local_a0.b[0];
  header_hash.b[1] = local_a0.b[1];
  header_hash.b[2] = local_a0.b[2];
  header_hash.b[3] = local_a0.b[3];
  header_hash.b[4] = local_a0.b[4];
  header_hash.b[5] = local_a0.b[5];
  header_hash.b[6] = local_a0.b[6];
  header_hash.b[7] = local_a0.b[7];
  header_hash.b[0x10] = local_a0.b[0x10];
  header_hash.b[0x11] = local_a0.b[0x11];
  header_hash.b[0x12] = local_a0.b[0x12];
  header_hash.b[0x13] = local_a0.b[0x13];
  header_hash.b[0x14] = local_a0.b[0x14];
  header_hash.b[0x15] = local_a0.b[0x15];
  header_hash.b[0x16] = local_a0.b[0x16];
  header_hash.b[0x17] = local_a0.b[0x17];
  header_hash.b[0x18] = local_a0.b[0x18];
  header_hash.b[0x19] = local_a0.b[0x19];
  header_hash.b[0x1a] = local_a0.b[0x1a];
  header_hash.b[0x1b] = local_a0.b[0x1b];
  header_hash.b[0x1c] = local_a0.b[0x1c];
  header_hash.b[0x1d] = local_a0.b[0x1d];
  header_hash.b[0x1e] = local_a0.b[0x1e];
  header_hash.b[0x1f] = local_a0.b[0x1f];
  ethash_light_compute(&local_e8,light,header_hash,0x50377003e5d830ca);
  local_50 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x285);
  if ((string)local_e8.result.b[0] == (string)0x25) {
    lVar4 = -1;
    do {
      if (lVar4 == 0x1e) break;
      uVar3 = lVar4 + 2;
      pcVar1 = &DAT_0012d64e + lVar4;
      lVar4 = lVar4 + 1;
    } while (*(char *)((long)&local_e8 + uVar3) == *pcVar1);
  }
  sStack_f0.pi_ = (sp_counted_base *)0x0;
  local_28 = &local_70;
  local_70 = "ethash_check_difficulty(&ret.result, &difficulty)";
  local_68 = "";
  local_38 = 0;
  local_40 = &PTR__lazy_ostream_0013e110;
  local_30 = &boost::unit_test::lazy_ostream::inst;
  local_80 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_78 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_f0);
  ethash_light_delete(light);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_block60000_verification) {
	// from POC-9 testnet, epoch 2
	ethash_light_t light = ethash_light_new(60000);
	ethash_h256_t seedhash = stringToBlockhash("5fc898f16035bf5ac9c6d9077ae1e3d5fc1ecc3c9fd5bee8bb00e810fdacbaa0");
	BOOST_ASSERT(light);
	ethash_return_value_t ret = ethash_light_compute(
		light,
		seedhash,
		0x50377003e5d830caU
	);
	ethash_h256_t difficulty = ethash_h256_static_init(0x25, 0xa6, 0x1e);
	BOOST_REQUIRE(ethash_check_difficulty(&ret.result, &difficulty));
	ethash_light_delete(light);
}